

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O3

JavascriptAsyncSpawnStepFunction * __thiscall
Js::JavascriptLibrary::CreateAsyncSpawnStepFunction
          (JavascriptLibrary *this,JavascriptMethod entryPoint,JavascriptGenerator *generator,
          Var argument,Var resolve,Var reject,bool isReject)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  Recycler *pRVar4;
  FunctionInfo *this_00;
  DynamicType *type;
  undefined4 *puVar5;
  JavascriptAsyncSpawnStepFunction *this_01;
  undefined1 local_78 [8];
  TrackAllocData data;
  
  local_78 = (undefined1  [8])&FunctionInfo::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_765c5cc;
  data.filename._0_4_ = 0x1831;
  data._32_8_ = reject;
  pRVar4 = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_78);
  this_00 = (FunctionInfo *)new<Memory::Recycler>(0x20,pRVar4,0x387914);
  FunctionInfo::FunctionInfo(this_00,entryPoint,None,0xffffffff,(FunctionProxy *)0x0);
  if (this->inDispatchProfileMode != false) {
    entryPoint = ScriptContext::DebugProfileProbeThunk;
  }
  type = DynamicType::New((this->super_JavascriptLibraryBase).scriptContext.ptr,TypeIds_Function,
                          &((this->super_JavascriptLibraryBase).functionPrototype.ptr)->
                           super_RecyclableObject,entryPoint,
                          (DynamicTypeHandler *)
                          &DeferredTypeHandler<&(bool_Js::JavascriptLibrary::InitializeFunction<true,true,false,false>(Js::DynamicObject*,Js::DeferredTypeHandlerBase*,Js::DeferredInitializeMode)),Js::InitializeFunctionDeferredTypeHandlerFilter<true,true,false>,false,(unsigned_short)0,(unsigned_short)0>
                           ::defaultInstance,false,false);
  local_78 = (undefined1  [8])&JavascriptAsyncSpawnStepFunction::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_765c5cc;
  data.filename._0_4_ = 0x183f;
  pRVar4 = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_78);
  BVar3 = ExceptionCheck::CanHandleOutOfMemory();
  if (BVar3 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.h"
                                ,0xa63,"(ExceptionCheck::CanHandleOutOfMemory())",
                                "ExceptionCheck::CanHandleOutOfMemory()");
    if (!bVar2) goto LAB_00bef385;
    *puVar5 = 0;
  }
  this_01 = (JavascriptAsyncSpawnStepFunction *)
            Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)1,false>
                      (pRVar4,0x68);
  if (this_01 == (JavascriptAsyncSpawnStepFunction *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.h"
                                ,0xa70,"(buffer != nullptr)","buffer != nullptr");
    if (!bVar2) {
LAB_00bef385:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  JavascriptAsyncSpawnStepFunction::JavascriptAsyncSpawnStepFunction
            (this_01,type,this_00,generator,argument,resolve,(Var)data._32_8_,isReject);
  return this_01;
}

Assistant:

JavascriptAsyncSpawnStepFunction* JavascriptLibrary::CreateAsyncSpawnStepFunction(
        JavascriptMethod entryPoint,
        JavascriptGenerator* generator,
        Var argument,
        Var resolve,
        Var reject,
        bool isReject)
    {
        FunctionInfo* functionInfo = RecyclerNew(GetRecycler(), FunctionInfo, entryPoint);
        DynamicType* type = CreateDeferredPrototypeFunctionType(
            this->inDispatchProfileMode ? ProfileEntryThunk : entryPoint);

        return RecyclerNewEnumClass(
            GetRecycler(),
            EnumFunctionClass,
            JavascriptAsyncSpawnStepFunction,
            type,
            functionInfo,
            generator,
            argument,
            resolve,
            reject,
            isReject);
    }